

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsLoadSignalHandlerCallback(_func_HelicsBool_int *handler,HelicsBool useSeparateThread)

{
  code *__handler;
  
  (anonymous_namespace)::keyHandler = handler;
  if (handler != (_func_HelicsBool_int *)0x0) {
    if (useSeparateThread == 0) {
      __handler = anon_unknown.dwarf_1862f::signalHandlerCallback;
    }
    else {
      __handler = anon_unknown.dwarf_1862f::signalHandlerThreadedCallback;
    }
    signal(2,__handler);
    return;
  }
  if (useSeparateThread != 0) {
    signal(2,anon_unknown.dwarf_1862f::signalHandlerThreaded);
    return;
  }
  helicsLoadSignalHandler();
  return;
}

Assistant:

void helicsLoadSignalHandlerCallback(HelicsBool (*handler)(int), HelicsBool useSeparateThread)
{
    keyHandler = handler;
    if (handler != nullptr) {
        if (useSeparateThread != HELICS_FALSE) {
            static_cast<void>(signal(SIGINT, signalHandlerThreadedCallback));
        } else {
            static_cast<void>(signal(SIGINT, signalHandlerCallback));
        }

    } else {
        if (useSeparateThread != HELICS_FALSE) {
            helicsLoadThreadedSignalHandler();
        } else {
            helicsLoadSignalHandler();
        }
    }
}